

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  pointer pcVar1;
  cmCommand *command;
  _func_int **local_50;
  cmMakefile *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  size_type sStack_38;
  
  command = (cmCommand *)operator_new(0x58);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = (_func_int **)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  command->Makefile = (cmMakefile *)0x0;
  (command->Error)._M_dataplus._M_p = (pointer)&(command->Error).field_2;
  (command->Error)._M_string_length = 0;
  (command->Error).field_2._M_local_buf[0] = '\0';
  command->_vptr_cmCommand = (_func_int **)&PTR__cmUnexpectedCommand_00674668;
  command[1]._vptr_cmCommand = (_func_int **)&command[1].Error;
  if (local_50 == (_func_int **)&local_40) {
    command[1].Error._M_dataplus._M_p = (pointer)CONCAT71(uStack_3f,local_40);
    command[1].Error._M_string_length = sStack_38;
  }
  else {
    command[1]._vptr_cmCommand = local_50;
    command[1].Error._M_dataplus._M_p = (pointer)CONCAT71(uStack_3f,local_40);
  }
  command[1].Makefile = local_48;
  local_48 = (cmMakefile *)0x0;
  local_40 = 0;
  command[1].Error.field_2._M_allocated_capacity = (size_type)error;
  local_50 = (_func_int **)&local_40;
  AddBuiltinCommand(this,name,command);
  if (local_50 != (_func_int **)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(name, new cmUnexpectedCommand(name, error));
}